

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O3

SharedPtr<KeyFileReader<NWN::ResRef16>_> * __thiscall
swutil::SharedPtr<KeyFileReader<NWN::ResRef16>_>::operator=
          (SharedPtr<KeyFileReader<NWN::ResRef16>_> *this,
          SharedPtr<KeyFileReader<NWN::ResRef16>_> *Other)

{
  int *piVar1;
  int *piVar2;
  
  piVar1 = this->m_SharedState;
  piVar2 = Other->m_SharedState;
  if (piVar1 != piVar2) {
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (this->m_Ptr != (KeyFileReader<NWN::ResRef16> *)0x0) {
          (*(this->m_Ptr->super_IResourceAccessor<NWN::ResRef32>)._vptr_IResourceAccessor[10])();
        }
        free(this->m_SharedState);
      }
      piVar2 = Other->m_SharedState;
    }
    this->m_SharedState = piVar2;
    this->m_Ptr = Other->m_Ptr;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
  }
  return this;
}

Assistant:

SharedPtr& operator=(
			 const SharedPtr & Other
			)
		{
			if (m_SharedState == Other.m_SharedState)
				return *this;

			if (m_SharedState)
			{
				if (!InterlockedDecrementPtr( m_SharedState ))
				{
					SharedPtrDeleterDelete( m_Ptr );
					SharedPtrDeleteSharedState( m_SharedState );
				}
			}

			m_SharedState = Other.m_SharedState;
			m_Ptr         = Other.m_Ptr;

			if (m_SharedState)
				InterlockedIncrementPtr( m_SharedState );

			return *this;
		}